

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

void __thiscall
tonk::gateway::StateMachine::BeginGatewayXMLRequest(StateMachine *this,int gatewayIndex)

{
  ostringstream *this_00;
  pointer pGVar1;
  AsioHost *pAVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  size_t sVar8;
  pointer puVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ostream *poVar12;
  _Alloc_hider _Var13;
  OutputWorker *this_01;
  pointer pcVar14;
  Result result;
  shared_ptr<tonk::gateway::HTTPRequester> requester;
  string request;
  ostringstream oss;
  undefined1 local_450 [16];
  undefined1 local_440 [8];
  undefined1 local_438 [16];
  undefined1 auStack_428 [24];
  _Alloc_hider local_410;
  HTTPRequester *local_408;
  undefined1 local_400 [8];
  undefined1 local_3f8 [40];
  __uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
  local_3d0;
  char local_3c8 [16];
  string local_3b8 [8];
  long local_3b0;
  char local_3a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  _Any_data _Stack_380;
  _Manager_type p_Stack_370;
  undefined4 uStack_368;
  undefined4 local_364;
  undefined4 uStack_360;
  undefined8 uStack_35c;
  _Any_data local_350;
  undefined1 local_340 [16];
  undefined1 local_330 [24];
  size_t local_318;
  undefined1 local_310 [8];
  pointer pcStack_308;
  char *local_300;
  pointer local_2f8;
  char local_2f0 [8];
  pointer puStack_2e8;
  undefined1 *local_2e0;
  undefined8 local_2d8;
  undefined1 local_2d0 [8];
  unique_ptr<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
  uStack_2c8;
  undefined1 local_2c0;
  undefined1 uStack_2bf;
  undefined4 local_2b8;
  undefined4 local_2b4;
  ios_base local_2b0 [8];
  void *pvStack_2a8;
  undefined8 local_2a0;
  _Manager_type p_Stack_298;
  undefined4 uStack_290;
  undefined4 local_28c;
  undefined4 uStack_288;
  undefined8 uStack_284;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar14 = (pointer)((long)gatewayIndex * 200);
  *(int *)(pcVar14 +
          (long)&((this->GatewayEndpoints).
                  super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                  ._M_impl.super__Vector_impl_data._M_start)->RetriesRemaining) =
       *(int *)(pcVar14 +
               (long)&((this->GatewayEndpoints).
                       super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                       ._M_impl.super__Vector_impl_data._M_start)->RetriesRemaining) + -1;
  local_450._8_8_ = operator_new(0x1a8,(nothrow_t *)&std::nothrow);
  if ((HTTPRequester *)local_450._8_8_ != (HTTPRequester *)0x0) {
    (((HTTPRequester *)local_450._8_8_)->BodyContent).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((HTTPRequester *)local_450._8_8_)->ContentLength = 0;
    *(undefined8 *)&((HTTPRequester *)local_450._8_8_)->HTTPStatusCode = 0;
    (((HTTPRequester *)local_450._8_8_)->Socket_TCP_Control)._M_t.
    super___uniq_ptr_impl<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
    .
    super__Head_base<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_false>
    ._M_head_impl =
         (basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *)0x0;
    (((HTTPRequester *)local_450._8_8_)->TCPStreamBuf_Control)._M_t.
    super___uniq_ptr_impl<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
    .super__Head_base<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_false>._M_head_impl =
         (basic_streambuf<std::allocator<char>_> *)0x0;
    *(undefined8 *)&((HTTPRequester *)local_450._8_8_)->AsyncRefs = 0;
    ((HTTPRequester *)local_450._8_8_)->StartUsec = 0;
    *(undefined8 *)&((HTTPRequester *)local_450._8_8_)->Done = 0;
    (((HTTPRequester *)local_450._8_8_)->TCPStreamBuf).buffer_.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (((HTTPRequester *)local_450._8_8_)->TCPStreamBuf).buffer_.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (((HTTPRequester *)local_450._8_8_)->TCPStreamBuf).buffer_.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (((HTTPRequester *)local_450._8_8_)->BodyContent).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((HTTPRequester *)local_450._8_8_)->BodyContent).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((HTTPRequester *)local_450._8_8_)->BodyContent).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((HTTPRequester *)local_450._8_8_)->ContentLength = 0;
    *(undefined8 *)&((HTTPRequester *)local_450._8_8_)->HTTPStatusCode = 0;
    *(undefined8 *)&(((HTTPRequester *)local_450._8_8_)->TCPStreamBuf).field_0x8 = 0;
    *(undefined8 *)&(((HTTPRequester *)local_450._8_8_)->TCPStreamBuf).field_0x10 = 0;
    *(undefined8 *)&(((HTTPRequester *)local_450._8_8_)->TCPStreamBuf).field_0x18 = 0;
    *(undefined8 *)&(((HTTPRequester *)local_450._8_8_)->TCPStreamBuf).field_0x20 = 0;
    *(undefined8 *)&(((HTTPRequester *)local_450._8_8_)->TCPStreamBuf).field_0x28 = 0;
    *(undefined8 *)&(((HTTPRequester *)local_450._8_8_)->TCPStreamBuf).field_0x30 = 0;
    *(undefined8 *)&(((HTTPRequester *)local_450._8_8_)->TCPStreamBuf).field_0x38 = 0;
    (((HTTPRequester *)local_450._8_8_)->TCPStreamBuf).max_size_ = 0;
    (((HTTPRequester *)local_450._8_8_)->Request).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_450._8_8_)->Request).field_2 + 8) = 0;
    *(undefined8 *)&(((HTTPRequester *)local_450._8_8_)->Callback).super__Function_base._M_functor =
         0;
    *(undefined8 *)
     ((long)&(((HTTPRequester *)local_450._8_8_)->Callback).super__Function_base._M_functor + 8) = 0
    ;
    (((HTTPRequester *)local_450._8_8_)->Callback).super__Function_base._M_manager =
         (_Manager_type)0x0;
    (((HTTPRequester *)local_450._8_8_)->Callback)._M_invoker = (_Invoker_type)0x0;
    (((HTTPRequester *)local_450._8_8_)->Socket_TCP)._M_t.
    super___uniq_ptr_impl<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
    .
    super__Head_base<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_false>
    ._M_head_impl =
         (basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *)0x0;
    *(undefined8 *)&((HTTPRequester *)local_450._8_8_)->TCPStreamBuf = 0;
    (((HTTPRequester *)local_450._8_8_)->URL).IPAddr.ipv6_address_.scope_id_ = 0;
    *(undefined8 *)&(((HTTPRequester *)local_450._8_8_)->URL).TCPEndpoint.impl_.data_ = 0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_450._8_8_)->URL).TCPEndpoint.impl_.data_ + 8) =
         0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_450._8_8_)->URL).TCPEndpoint.impl_.data_ + 0x10)
         = 0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_450._8_8_)->URL).TCPEndpoint.impl_.data_ + 0x18)
         = 0;
    ((HTTPRequester *)local_450._8_8_)->Host = (AsioHost *)0x0;
    (((HTTPRequester *)local_450._8_8_)->Request)._M_dataplus._M_p = (pointer)0x0;
    (((HTTPRequester *)local_450._8_8_)->Request)._M_string_length = 0;
    (((HTTPRequester *)local_450._8_8_)->URL).IP._M_dataplus._M_p = (pointer)0x0;
    (((HTTPRequester *)local_450._8_8_)->URL).IP._M_string_length = 0;
    (((HTTPRequester *)local_450._8_8_)->URL).IP.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_450._8_8_)->URL).IP.field_2 + 8) = 0;
    *(undefined8 *)&(((HTTPRequester *)local_450._8_8_)->URL).Port = 0;
    (((HTTPRequester *)local_450._8_8_)->URL).IPAddr.type_ = ipv4;
    (((HTTPRequester *)local_450._8_8_)->URL).IPAddr.ipv4_address_ = (in4_addr_type)0x0;
    *(undefined8 *)&(((HTTPRequester *)local_450._8_8_)->URL).IPAddr.ipv6_address_.addr_.__in6_u = 0
    ;
    *(undefined8 *)
     ((long)&(((HTTPRequester *)local_450._8_8_)->URL).IPAddr.ipv6_address_.addr_.__in6_u + 8) = 0;
    (((HTTPRequester *)local_450._8_8_)->URL).FullURL._M_dataplus._M_p = (pointer)0x0;
    (((HTTPRequester *)local_450._8_8_)->URL).FullURL._M_string_length = 0;
    (((HTTPRequester *)local_450._8_8_)->URL).FullURL.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_450._8_8_)->URL).FullURL.field_2 + 8) = 0;
    (((HTTPRequester *)local_450._8_8_)->URL).XMLPath._M_dataplus._M_p = (pointer)0x0;
    (((HTTPRequester *)local_450._8_8_)->URL).XMLPath._M_string_length = 0;
    (((HTTPRequester *)local_450._8_8_)->URL).XMLPath.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_450._8_8_)->URL).XMLPath.field_2 + 8) = 0;
    HTTPRequester::HTTPRequester((HTTPRequester *)local_450._8_8_);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tonk::gateway::HTTPRequester*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_440,
             (HTTPRequester *)local_450._8_8_);
  if ((HTTPRequester *)local_450._8_8_ != (HTTPRequester *)0x0) {
    pGVar1 = (this->GatewayEndpoints).
             super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_3f8._0_8_ = local_3f8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3f8,*(long *)(pcVar14 + (long)pGVar1),
               *(long *)(pcVar14 + (long)&(pGVar1->URL).FullURL._M_string_length) +
               *(long *)(pcVar14 + (long)pGVar1));
    local_3f8._32_8_ = local_3c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_3f8 + 0x20),*(long *)(pcVar14 + (long)&(pGVar1->URL).XMLPath),
               *(long *)(pcVar14 + (long)&(pGVar1->URL).XMLPath._M_string_length) +
               *(long *)(pcVar14 + (long)&(pGVar1->URL).XMLPath));
    local_3b8 = (string  [8])local_3a8;
    std::__cxx11::string::_M_construct<char*>
              (local_3b8,*(long *)(pcVar14 + (long)&(pGVar1->URL).IP),
               *(long *)(pcVar14 + (long)&(pGVar1->URL).IP._M_string_length) +
               *(long *)(pcVar14 + (long)&(pGVar1->URL).IP));
    local_3a8[0x10] = (pcVar14 + (long)&(pGVar1->URL).Port)[0];
    local_3a8[0x11] = (pcVar14 + (long)&(pGVar1->URL).Port)[1];
    local_390._M_allocated_capacity = *(undefined8 *)(pcVar14 + (long)&(pGVar1->URL).IPAddr);
    local_390._8_8_ = *(undefined8 *)(pcVar14 + (long)&(pGVar1->URL).IPAddr.ipv6_address_);
    _Stack_380._M_unused._0_8_ =
         (undefined8)
         *(undefined8 *)(pcVar14 + (long)((long)&(pGVar1->URL).IPAddr.ipv6_address_ + 8));
    _Stack_380._8_8_ =
         *(undefined8 *)(pcVar14 + (long)((long)&(pGVar1->URL).IPAddr.ipv6_address_ + 0x10));
    p_Stack_370 = *(_Manager_type *)(pcVar14 + (long)&(pGVar1->URL).TCPEndpoint);
    pcVar3 = pcVar14 + (long)((long)&(pGVar1->URL).TCPEndpoint.impl_ + 0x14);
    uStack_35c._0_1_ = pcVar3[0];
    uStack_35c._1_1_ = pcVar3[1];
    uStack_35c._2_1_ = pcVar3[2];
    uStack_35c._3_1_ = pcVar3[3];
    uStack_35c._4_1_ = pcVar3[4];
    uStack_35c._5_1_ = pcVar3[5];
    uStack_35c._6_1_ = pcVar3[6];
    uStack_35c._7_1_ = pcVar3[7];
    uStack_360 = (undefined4)
                 ((ulong)*(undefined8 *)
                          (pcVar14 + (long)((long)&(pGVar1->URL).TCPEndpoint.impl_ + 0xc)) >> 0x20);
    uStack_368 = (undefined4)
                 *(undefined8 *)(pcVar14 + (long)((long)&(pGVar1->URL).TCPEndpoint.impl_ + 8));
    local_364 = (undefined4)
                ((ulong)*(undefined8 *)
                         (pcVar14 + (long)((long)&(pGVar1->URL).TCPEndpoint.impl_ + 8)) >> 0x20);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"GET /",5);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_3f8._32_8_,
                         (long)local_3d0._M_t.
                               super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
                               .super__Head_base<0UL,_asio::io_context::strand_*,_false>.
                               _M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," HTTP/1.1\r\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Host: ",6);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_3b8,local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\r\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Accept: text/html,application/xhtml+xml,application/xml\r\n\r\n",0x3b);
    std::__cxx11::stringbuf::str();
    uVar4 = local_450._8_8_;
    pAVar2 = this->Host;
    local_330._16_8_ = local_310;
    local_330._0_8_ = this;
    local_330._8_4_ = gatewayIndex;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_330 + 0x10),local_3f8._0_8_,
               (undefined1 *)((long)(StateMachine **)local_3f8._8_8_ + local_3f8._0_8_));
    local_300 = local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,local_3f8._32_8_,
               (char *)((long)local_3d0._M_t.
                              super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
                              .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl
                       + local_3f8._32_8_));
    local_408 = (HTTPRequester *)uVar4;
    auStack_428._16_8_ = this;
    local_410._M_p = pcVar14;
    local_400 = (undefined1  [8])pAVar2;
    local_2e0 = local_2d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,local_3b8,(char *)(local_3b0 + (long)local_3b8));
    uVar4 = _Stack_380._8_8_;
    uVar5 = local_3a8._16_2_;
    uVar6 = local_390._M_allocated_capacity._0_4_;
    uVar7 = local_390._M_allocated_capacity._4_4_;
    local_2c0 = local_3a8[0x10];
    uStack_2bf = local_3a8[0x11];
    local_2b8 = local_390._M_allocated_capacity._0_4_;
    local_2b4 = local_390._M_allocated_capacity._4_4_;
    local_2b0[0] = (ios_base)local_390._M_local_buf[8];
    local_2b0[1] = (ios_base)local_390._M_local_buf[9];
    local_2b0[2] = (ios_base)local_390._M_local_buf[10];
    local_2b0[3] = (ios_base)local_390._M_local_buf[0xb];
    local_2b0[4] = (ios_base)local_390._M_local_buf[0xc];
    local_2b0[5] = (ios_base)local_390._M_local_buf[0xd];
    local_2b0[6] = (ios_base)local_390._M_local_buf[0xe];
    local_2b0[7] = (ios_base)local_390._M_local_buf[0xf];
    pvStack_2a8 = _Stack_380._M_unused._M_object;
    local_2a0 = _Stack_380._8_8_;
    uStack_288 = uStack_360;
    uStack_284 = uStack_35c;
    p_Stack_298 = p_Stack_370;
    uStack_290 = uStack_368;
    local_28c = local_364;
    _local_438 = (string)(ZEXT832(0) << 0x20);
    _Var13._M_p = (pointer)operator_new(0xb8);
    uVar10 = local_2d8;
    puVar9 = local_2f8;
    sVar8 = local_318;
    *(undefined8 *)_Var13._M_p = local_330._0_8_;
    *(undefined4 *)(_Var13._M_p + 8) = local_330._8_4_;
    *(pointer *)(_Var13._M_p + 0x10) = _Var13._M_p + 0x20;
    if ((undefined1 *)local_330._16_8_ == local_310) {
      *(ulong *)(_Var13._M_p + 0x20) = CONCAT71(local_310._1_7_,local_310[0]);
      *(pointer *)(_Var13._M_p + 0x28) = pcStack_308;
    }
    else {
      *(undefined8 *)(_Var13._M_p + 0x10) = local_330._16_8_;
      *(ulong *)(_Var13._M_p + 0x20) = CONCAT71(local_310._1_7_,local_310[0]);
    }
    local_318 = 0;
    local_310[0] = 0;
    *(size_t *)(_Var13._M_p + 0x18) = sVar8;
    *(pointer *)(_Var13._M_p + 0x30) = _Var13._M_p + 0x40;
    if (local_300 == local_2f0) {
      *(ulong *)(_Var13._M_p + 0x40) = CONCAT71(local_2f0._1_7_,local_2f0[0]);
      *(pointer *)(_Var13._M_p + 0x48) = puStack_2e8;
    }
    else {
      *(char **)(_Var13._M_p + 0x30) = local_300;
      *(ulong *)(_Var13._M_p + 0x40) = CONCAT71(local_2f0._1_7_,local_2f0[0]);
    }
    local_2f8 = (pointer)0x0;
    local_2f0[0] = '\0';
    *(pointer *)(_Var13._M_p + 0x38) = puVar9;
    *(pointer *)(_Var13._M_p + 0x50) = _Var13._M_p + 0x60;
    if (local_2e0 == local_2d0) {
      *(ulong *)(_Var13._M_p + 0x60) = CONCAT71(local_2d0._1_7_,local_2d0[0]);
      ((_Tuple_impl<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
        *)(_Var13._M_p + 0x68))->
      super__Head_base<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_false> =
           (_Head_base<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_false>)
           uStack_2c8._M_t.
           super___uniq_ptr_impl<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
           .super__Head_base<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_false>.
           _M_head_impl;
    }
    else {
      *(undefined1 **)(_Var13._M_p + 0x50) = local_2e0;
      *(ulong *)(_Var13._M_p + 0x60) = CONCAT71(local_2d0._1_7_,local_2d0[0]);
    }
    local_2d8 = 0;
    uVar11 = local_2d8;
    local_2d0[0] = 0;
    local_438._0_8_ = _Var13._M_p;
    local_2d8._0_1_ = (undefined1)uVar10;
    local_2d8._1_1_ = SUB81(uVar10,1);
    local_2d8._2_1_ = SUB81(uVar10,2);
    local_2d8._3_1_ = SUB81(uVar10,3);
    local_2d8._4_1_ = SUB81(uVar10,4);
    local_2d8._5_1_ = SUB81(uVar10,5);
    local_2d8._6_1_ = SUB81(uVar10,6);
    local_2d8._7_1_ = SUB81(uVar10,7);
    _Var13._M_p[0x58] = (undefined1)local_2d8;
    _Var13._M_p[0x59] = local_2d8._1_1_;
    _Var13._M_p[0x5a] = local_2d8._2_1_;
    _Var13._M_p[0x5b] = local_2d8._3_1_;
    _Var13._M_p[0x5c] = local_2d8._4_1_;
    _Var13._M_p[0x5d] = local_2d8._5_1_;
    _Var13._M_p[0x5e] = local_2d8._6_1_;
    _Var13._M_p[0x5f] = local_2d8._7_1_;
    *(undefined2 *)(_Var13._M_p + 0x70) = uVar5;
    *(undefined4 *)(_Var13._M_p + 0x78) = uVar6;
    *(undefined4 *)(_Var13._M_p + 0x7c) = uVar7;
    auStack_428._0_8_ =
         std::
         _Function_handler<void_(const_tonk::Result_&,_unsigned_int,_const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1071:9)>
         ::_M_manager;
    auStack_428._8_8_ =
         std::
         _Function_handler<void_(const_tonk::Result_&,_unsigned_int,_const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1071:9)>
         ::_M_invoke;
    *(undefined8 *)(_Var13._M_p + 0x80) = local_390._8_8_;
    *(void **)(_Var13._M_p + 0x88) = _Stack_380._M_unused._M_object;
    *(undefined8 *)(_Var13._M_p + 0x90) = uVar4;
    *(_Manager_type *)(_Var13._M_p + 0x98) = p_Stack_370;
    *(ulong *)(_Var13._M_p + 0xa0) = CONCAT44(local_364,uStack_368);
    *(ulong *)(_Var13._M_p + 0xa4) = CONCAT44(uStack_360,local_364);
    _Var13._M_p[0xac] = (undefined1)uStack_35c;
    _Var13._M_p[0xad] = uStack_35c._1_1_;
    _Var13._M_p[0xae] = uStack_35c._2_1_;
    _Var13._M_p[0xaf] = uStack_35c._3_1_;
    _Var13._M_p[0xb0] = uStack_35c._4_1_;
    _Var13._M_p[0xb1] = uStack_35c._5_1_;
    _Var13._M_p[0xb2] = uStack_35c._6_1_;
    _Var13._M_p[0xb3] = uStack_35c._7_1_;
    local_330._16_8_ = local_310;
    local_300 = local_2f0;
    local_2e0 = local_2d0;
    local_2d8 = uVar11;
    HTTPRequester::Begin
              ((HTTPRequester *)local_450,&local_408->URL,(AsioHost *)local_3f8,(string *)local_400,
               (HTTPCallback *)&local_350);
    _Var13._M_p = local_410._M_p;
    if ((code *)auStack_428._0_8_ != (code *)0x0) {
      (*(code *)auStack_428._0_8_)(local_438,local_438,3);
    }
    if (local_2e0 != local_2d0) {
      operator_delete(local_2e0);
    }
    if (local_300 != local_2f0) {
      operator_delete(local_300);
    }
    if ((undefined1 *)local_330._16_8_ != local_310) {
      operator_delete((void *)local_330._16_8_);
    }
    if ((ErrorResult *)local_450._0_8_ == (ErrorResult *)0x0) {
      pGVar1 = (((vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                  *)(auStack_428._16_8_ + 0x70))->
               super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      (_Var13._M_p +
      (long)&(pGVar1->Requester).
             super___shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount))[-1]._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_450._8_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (_Var13._M_p +
                 (long)&(pGVar1->Requester).
                        super___shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount),(__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_440);
    }
    else {
      Result::ToJson_abi_cxx11_((string *)local_438,(Result *)local_450);
      if (DAT_001e1cd0 < 5) {
        this_00 = (ostringstream *)(local_330 + 0x10);
        local_330._0_8_ = ModuleLogger;
        local_330._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,DAT_001e1d00,DAT_001e1d08);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Failed to start web request: ",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,(char *)local_438._0_8_,local_438._8_8_);
        this_01 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_330);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_2b0);
      }
      if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
        operator_delete((void *)local_438._0_8_);
      }
    }
    Result::~Result((Result *)local_450);
    if ((undefined1 *)local_350._M_unused._0_8_ != local_340) {
      operator_delete(local_350._M_unused._M_object);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_3b8 != (string  [8])local_3a8) {
      operator_delete((void *)local_3b8);
    }
    if ((char *)local_3f8._32_8_ != local_3c8) {
      operator_delete((void *)local_3f8._32_8_);
    }
    if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_);
    }
  }
  if (local_440 != (undefined1  [8])0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_440);
  }
  return;
}

Assistant:

void StateMachine::BeginGatewayXMLRequest(int gatewayIndex)
{
    // Decrement retry count
    GatewayEndpoints[gatewayIndex].RetriesRemaining--;

    std::shared_ptr<HTTPRequester> requester = MakeSharedNoThrow<HTTPRequester>();
    if (!requester) {
        return;
    }

    ParsedURL url = GatewayEndpoints[gatewayIndex].URL;

    std::ostringstream oss;
    oss << "GET /" << url.XMLPath << " HTTP/1.1\r\n";
    oss << "Host: " << url.IP << ":" << url.Port << "\r\n";
    oss << "Accept: text/html,application/xhtml+xml,application/xml\r\n\r\n";
    std::string request = oss.str();

    Result result = requester->Begin(
        url,
        Host,
        request,
        [this, gatewayIndex, url](
            const Result& result,
            unsigned code,
            const char* response,
            unsigned bytes)
    {
        if (result.IsFail()) {
            ModuleLogger.Error("Request for XML description failed: ", result.ToJson());
            return;
        }

        // Stop trying if we got a response
        this->GatewayEndpoints[gatewayIndex].RetriesRemaining = 0;

        // Request is now considered completed
        this->GatewayEndpoints[gatewayIndex].Completed = true;

        // If HTTP response code was not 200 OK:
        if (code != 200) {
            ModuleLogger.Error("Request for XML description failed. Server returned error code: ", code);
            return;
        }

        // Parse XML response
        ParsedXML xml;
        Result parseResult = xml.Parse(response, bytes);
        if (parseResult.IsFail()) {
            ModuleLogger.Error("Failed to parse XML: ", parseResult.ToJson());
            return;
        }

        // Handle response
        this->OnXMLResponse(url, xml);
    });

    if (result.IsFail()) {
        ModuleLogger.Error("Failed to start web request: ", result.ToJson());
        return;
    }

    GatewayEndpoints[gatewayIndex].Requester = requester;
}